

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewCreateTests.cpp
# Opt level: O0

TestCaseGroup * vkt::api::createBufferViewCreateTests(TestContext *testCtx)

{
  BufferViewCaseParameters createInfo;
  BufferViewCaseParameters createInfo_00;
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  ostream *poVar3;
  TestNode *pTVar4;
  BufferViewTestCase *pBVar5;
  string local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  uint uStack_420;
  undefined4 uStack_41c;
  BufferViewCaseParameters testParams_1;
  string local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  uint uStack_370;
  undefined4 uStack_36c;
  BufferViewCaseParameters testParams;
  ostringstream local_330 [8];
  ostringstream testDescription;
  ostringstream local_1b8 [8];
  ostringstream testName;
  uint local_3c;
  deUint32 format;
  VkDeviceSize range;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> bufferViewTests;
  TestContext *testCtx_local;
  
  bufferViewTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = testCtx;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    bufferViewTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"create","BufferView Construction Tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&range + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar2
            );
  for (local_3c = 1; local_3c < 0xb9; local_3c = local_3c + 1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    std::__cxx11::ostringstream::ostringstream(local_330);
    poVar3 = std::operator<<((ostream *)local_1b8,"create_buffer_view_");
    std::ostream::operator<<(poVar3,local_3c);
    poVar3 = std::operator<<((ostream *)local_330,"vkBufferView test ");
    std::__cxx11::ostringstream::str();
    std::operator<<(poVar3,(string *)&testParams.usage);
    std::__cxx11::string::~string((string *)&testParams.usage);
    uStack_370 = local_3c;
    testParams.format = VK_FORMAT_UNDEFINED;
    testParams._4_4_ = 0;
    testParams.offset = 0xffffffffffffffff;
    testParams.range._0_4_ = 4;
    testParams.range._4_4_ = 8;
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    pBVar5 = (BufferViewTestCase *)operator_new(0x90);
    uVar1 = bufferViewTests.
            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
            _8_8_;
    testParams_1.features._3_1_ = 1;
    std::__cxx11::ostringstream::str();
    std::operator+(&local_390,&local_3b0,"_uniform");
    std::__cxx11::ostringstream::str();
    createInfo._4_4_ = uStack_36c;
    createInfo.format = uStack_370;
    createInfo.features = testParams.range._4_4_;
    createInfo.usage = (undefined4)testParams.range;
    createInfo.offset = testParams._0_8_;
    createInfo.range = testParams.offset;
    anon_unknown_1::BufferViewTestCase::BufferViewTestCase
              (pBVar5,(TestContext *)uVar1,&local_390,&local_3d0,createInfo);
    testParams_1.features._3_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_3b0);
    uStack_420 = local_3c;
    testParams_1.format = VK_FORMAT_UNDEFINED;
    testParams_1._4_4_ = 0;
    testParams_1.offset = 0xffffffffffffffff;
    testParams_1.range._0_4_ = 8;
    testParams_1.range._4_4_ = 0x10;
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    pBVar5 = (BufferViewTestCase *)operator_new(0x90);
    uVar1 = bufferViewTests.
            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
            _8_8_;
    std::__cxx11::ostringstream::str();
    std::operator+(&local_440,&local_460,"_storage");
    std::__cxx11::ostringstream::str();
    createInfo_00._4_4_ = uStack_41c;
    createInfo_00.format = uStack_420;
    createInfo_00.features = testParams_1.range._4_4_;
    createInfo_00.usage = (undefined4)testParams_1.range;
    createInfo_00.offset = testParams_1._0_8_;
    createInfo_00.range = testParams_1.offset;
    anon_unknown_1::BufferViewTestCase::BufferViewTestCase
              (pBVar5,(TestContext *)uVar1,&local_440,&local_480,createInfo_00);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::ostringstream::~ostringstream(local_330);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  pTVar2 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar2;
}

Assistant:

tcu::TestCaseGroup* createBufferViewCreateTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	bufferViewTests	(new tcu::TestCaseGroup(testCtx, "create", "BufferView Construction Tests"));

	const VkDeviceSize range = VK_WHOLE_SIZE;
	for (deUint32 format = VK_FORMAT_UNDEFINED + 1; format < VK_CORE_FORMAT_LAST; format++)
	{
		std::ostringstream	testName;
		std::ostringstream	testDescription;
		testName << "create_buffer_view_" << format;
		testDescription << "vkBufferView test " << testName.str();
		{
			BufferViewCaseParameters testParams	=
			{
				(VkFormat)format,							// VkFormat				format;
				0,											// VkDeviceSize			offset;
				range,										// VkDeviceSize			range;
				VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT,	// VkBufferUsageFlags	usage;
				VK_FORMAT_FEATURE_UNIFORM_TEXEL_BUFFER_BIT, // VkFormatFeatureFlags flags;
			};
			bufferViewTests->addChild(new BufferViewTestCase(testCtx, testName.str() + "_uniform", testDescription.str(), testParams));
		}
		{
			BufferViewCaseParameters testParams	=
			{
				(VkFormat)format,							// VkFormat				format;
				0,											// VkDeviceSize			offset;
				range,										// VkDeviceSize			range;
				VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT,	// VkBufferUsageFlags	usage;
				VK_FORMAT_FEATURE_STORAGE_TEXEL_BUFFER_BIT, // VkFormatFeatureFlags flags;
			};
			bufferViewTests->addChild(new BufferViewTestCase(testCtx, testName.str() + "_storage", testDescription.str(), testParams));
		}
	}

	return bufferViewTests.release();
}